

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O3

void cdef_filter_8_2_avx2
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar22 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  
  lVar10 = (long)dir;
  lVar2 = (long)cdef_directions_padded[lVar10 + 4][0];
  lVar3 = (long)cdef_directions_padded[lVar10 + 4][1];
  lVar7 = (long)cdef_directions_padded[lVar10][0];
  lVar10 = (long)cdef_directions_padded[lVar10][1];
  auVar25._0_2_ = (undefined2)sec_strength;
  if (block_width == 8) {
    uVar4 = sec_damping;
    if (sec_strength != 0) {
      iVar1 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar4 = sec_damping - iVar1;
      if (sec_damping < iVar1) {
        uVar4 = 0;
      }
    }
    if (0 < block_height) {
      auVar25._2_2_ = auVar25._0_2_;
      auVar25._4_2_ = auVar25._0_2_;
      auVar25._6_2_ = auVar25._0_2_;
      auVar25._8_2_ = auVar25._0_2_;
      auVar25._10_2_ = auVar25._0_2_;
      auVar25._12_2_ = auVar25._0_2_;
      auVar25._14_2_ = auVar25._0_2_;
      auVar25._16_2_ = auVar25._0_2_;
      auVar25._18_2_ = auVar25._0_2_;
      auVar25._20_2_ = auVar25._0_2_;
      auVar25._22_2_ = auVar25._0_2_;
      auVar25._24_2_ = auVar25._0_2_;
      auVar25._26_2_ = auVar25._0_2_;
      auVar25._28_2_ = auVar25._0_2_;
      auVar25._30_2_ = auVar25._0_2_;
      auVar14._8_2_ = 2;
      auVar14._0_8_ = 0x2000200020002;
      auVar14._10_2_ = 2;
      auVar14._12_2_ = 2;
      auVar14._14_2_ = 2;
      auVar14._16_2_ = 2;
      auVar14._18_2_ = 2;
      auVar14._20_2_ = 2;
      auVar14._22_2_ = 2;
      auVar14._24_2_ = 2;
      auVar14._26_2_ = 2;
      auVar14._28_2_ = 2;
      auVar14._30_2_ = 2;
      auVar16._8_2_ = 1;
      auVar16._0_8_ = 0x1000100010001;
      auVar16._10_2_ = 1;
      auVar16._12_2_ = 1;
      auVar16._14_2_ = 1;
      auVar16._16_2_ = 1;
      auVar16._18_2_ = 1;
      auVar16._20_2_ = 1;
      auVar16._22_2_ = 1;
      auVar16._24_2_ = 1;
      auVar16._26_2_ = 1;
      auVar16._28_2_ = 1;
      auVar16._30_2_ = 1;
      uVar9 = 0;
      auVar17._8_2_ = 8;
      auVar17._0_8_ = 0x8000800080008;
      auVar17._10_2_ = 8;
      auVar17._12_2_ = 8;
      auVar17._14_2_ = 8;
      auVar17._16_2_ = 8;
      auVar17._18_2_ = 8;
      auVar17._20_2_ = 8;
      auVar17._22_2_ = 8;
      auVar17._24_2_ = 8;
      auVar17._26_2_ = 8;
      auVar17._28_2_ = 8;
      auVar17._30_2_ = 8;
      do {
        auVar19._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])in +
             ZEXT116(1) * *(undefined1 (*) [16])((long)in + 0x120);
        auVar19._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * *(undefined1 (*) [16])in;
        auVar18 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar2 * 2));
        auVar21 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar2 * 2));
        auVar23._16_16_ = auVar18;
        auVar23._0_16_ = auVar21;
        auVar18 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar2 * -2));
        auVar21 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar2 * -2 + 0x120));
        auVar32._16_16_ = auVar18;
        auVar32._0_16_ = auVar21;
        auVar18 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar7 * 2));
        auVar21 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar7 * 2));
        auVar46._16_16_ = auVar18;
        auVar46._0_16_ = auVar21;
        auVar18 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar7 * -2));
        auVar21 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar7 * -2 + 0x120));
        auVar61._16_16_ = auVar18;
        auVar61._0_16_ = auVar21;
        auVar24 = vpsubw_avx2(auVar23,auVar19);
        auVar70 = vpsraw_avx2(auVar24,0xf);
        auVar24 = vpabsw_avx2(auVar24);
        auVar34 = vpsrlw_avx2(auVar24,ZEXT416(uVar4));
        auVar34 = vpsubusw_avx2(auVar25,auVar34);
        auVar24 = vpminsw_avx2(auVar34,auVar24);
        auVar34 = vpaddw_avx2(auVar70,auVar24);
        auVar24 = vpsubw_avx2(auVar32,auVar19);
        auVar71 = vpsraw_avx2(auVar24,0xf);
        auVar24 = vpabsw_avx2(auVar24);
        auVar15 = vpsrlw_avx2(auVar24,ZEXT416(uVar4));
        auVar15 = vpsubusw_avx2(auVar25,auVar15);
        auVar24 = vpminsw_avx2(auVar15,auVar24);
        auVar24 = vpaddw_avx2(auVar71,auVar24);
        auVar34 = vpaddw_avx2(auVar71 ^ auVar24,auVar70 ^ auVar34);
        auVar24 = vpsubw_avx2(auVar46,auVar19);
        auVar71 = vpsraw_avx2(auVar24,0xf);
        auVar24 = vpabsw_avx2(auVar24);
        auVar13 = ZEXT416(uVar4);
        auVar15 = vpsrlw_avx2(auVar24,auVar13);
        auVar15 = vpsubusw_avx2(auVar25,auVar15);
        auVar24 = vpminsw_avx2(auVar15,auVar24);
        auVar15 = vpaddw_avx2(auVar71,auVar24);
        auVar24 = vpsubw_avx2(auVar61,auVar19);
        auVar62 = vpsraw_avx2(auVar24,0xf);
        auVar24 = vpabsw_avx2(auVar24);
        auVar70 = vpsrlw_avx2(auVar24,auVar13);
        auVar70 = vpsubusw_avx2(auVar25,auVar70);
        auVar24 = vpminsw_avx2(auVar24,auVar70);
        auVar24 = vpaddw_avx2(auVar24,auVar62);
        auVar24 = vpaddw_avx2(auVar24 ^ auVar62,auVar71 ^ auVar15);
        auVar24 = vpaddw_avx2(auVar34,auVar24);
        auVar70 = vpmullw_avx2(auVar24,auVar14);
        auVar18 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar3 * 2));
        auVar21 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar3 * 2));
        auVar33._16_16_ = auVar18;
        auVar33._0_16_ = auVar21;
        auVar18 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar3 * -2));
        auVar21 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar3 * -2 + 0x120));
        auVar47._16_16_ = auVar18;
        auVar47._0_16_ = auVar21;
        auVar18 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar10 * 2));
        auVar21 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar10 * 2));
        auVar63._16_16_ = auVar18;
        auVar63._0_16_ = auVar21;
        auVar18 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar10 * -2));
        auVar21 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar10 * -2 + 0x120));
        auVar72._16_16_ = auVar18;
        auVar72._0_16_ = auVar21;
        auVar24 = vpsubw_avx2(auVar33,auVar19);
        auVar71 = vpsraw_avx2(auVar24,0xf);
        auVar24 = vpabsw_avx2(auVar24);
        auVar34 = vpsrlw_avx2(auVar24,auVar13);
        auVar34 = vpsubusw_avx2(auVar25,auVar34);
        auVar24 = vpminsw_avx2(auVar34,auVar24);
        auVar34 = vpaddw_avx2(auVar71,auVar24);
        auVar24 = vpsubw_avx2(auVar47,auVar19);
        auVar62 = vpsraw_avx2(auVar24,0xf);
        auVar24 = vpabsw_avx2(auVar24);
        auVar15 = vpsrlw_avx2(auVar24,auVar13);
        auVar15 = vpsubusw_avx2(auVar25,auVar15);
        auVar24 = vpminsw_avx2(auVar24,auVar15);
        auVar24 = vpaddw_avx2(auVar24,auVar62);
        auVar34 = vpaddw_avx2(auVar24 ^ auVar62,auVar71 ^ auVar34);
        auVar24 = vpsubw_avx2(auVar63,auVar19);
        auVar62 = vpsraw_avx2(auVar24,0xf);
        auVar24 = vpabsw_avx2(auVar24);
        auVar15 = vpsrlw_avx2(auVar24,ZEXT416(uVar4));
        auVar15 = vpsubusw_avx2(auVar25,auVar15);
        auVar24 = vpminsw_avx2(auVar24,auVar15);
        auVar15 = vpaddw_avx2(auVar24,auVar62);
        auVar24 = vpsubw_avx2(auVar72,auVar19);
        auVar73 = vpsraw_avx2(auVar24,0xf);
        auVar24 = vpabsw_avx2(auVar24);
        auVar71 = vpsrlw_avx2(auVar24,ZEXT416(uVar4));
        auVar71 = vpsubusw_avx2(auVar25,auVar71);
        auVar24 = vpminsw_avx2(auVar24,auVar71);
        auVar24 = vpaddw_avx2(auVar24,auVar73);
        auVar24 = vpaddw_avx2(auVar15 ^ auVar62,auVar24 ^ auVar73);
        auVar24 = vpaddw_avx2(auVar24,auVar34);
        auVar24 = vpmullw_avx2(auVar24,auVar16);
        auVar24 = vpaddw_avx2(auVar24,auVar70);
        auVar34 = vpsraw_avx2(auVar24,0xf);
        auVar24 = vpaddw_avx2(auVar24,auVar17);
        auVar24 = vpaddw_avx2(auVar24,auVar34);
        auVar24 = vpsraw_avx2(auVar24,4);
        auVar24 = vpaddw_avx2(auVar24,auVar19);
        auVar24 = vpackuswb_avx2(auVar24,auVar25);
        *(long *)dest = auVar24._16_8_;
        *(long *)((long)dest + (long)dstride) = auVar24._0_8_;
        uVar9 = uVar9 + 2;
        in = (uint16_t *)((long)in + 0x240);
        dest = (void *)((long)dest + (long)dstride * 2);
      } while (uVar9 < (uint)block_height);
    }
  }
  else {
    uVar4 = sec_damping;
    if (sec_strength != 0) {
      iVar1 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar4 = sec_damping - iVar1;
      if (sec_damping < iVar1) {
        uVar4 = 0;
      }
    }
    if (0 < block_height) {
      auVar24._2_2_ = auVar25._0_2_;
      auVar24._0_2_ = auVar25._0_2_;
      auVar24._4_2_ = auVar25._0_2_;
      auVar24._6_2_ = auVar25._0_2_;
      auVar24._8_2_ = auVar25._0_2_;
      auVar24._10_2_ = auVar25._0_2_;
      auVar24._12_2_ = auVar25._0_2_;
      auVar24._14_2_ = auVar25._0_2_;
      auVar24._16_2_ = auVar25._0_2_;
      auVar24._18_2_ = auVar25._0_2_;
      auVar24._20_2_ = auVar25._0_2_;
      auVar24._22_2_ = auVar25._0_2_;
      auVar24._24_2_ = auVar25._0_2_;
      auVar24._26_2_ = auVar25._0_2_;
      auVar24._28_2_ = auVar25._0_2_;
      auVar24._30_2_ = auVar25._0_2_;
      auVar34._8_2_ = 2;
      auVar34._0_8_ = 0x2000200020002;
      auVar34._10_2_ = 2;
      auVar34._12_2_ = 2;
      auVar34._14_2_ = 2;
      auVar34._16_2_ = 2;
      auVar34._18_2_ = 2;
      auVar34._20_2_ = 2;
      auVar34._22_2_ = 2;
      auVar34._24_2_ = 2;
      auVar34._26_2_ = 2;
      auVar34._28_2_ = 2;
      auVar34._30_2_ = 2;
      auVar15._8_2_ = 1;
      auVar15._0_8_ = 0x1000100010001;
      auVar15._10_2_ = 1;
      auVar15._12_2_ = 1;
      auVar15._14_2_ = 1;
      auVar15._16_2_ = 1;
      auVar15._18_2_ = 1;
      auVar15._20_2_ = 1;
      auVar15._22_2_ = 1;
      auVar15._24_2_ = 1;
      auVar15._26_2_ = 1;
      auVar15._28_2_ = 1;
      auVar15._30_2_ = 1;
      lVar6 = (long)dstride;
      lVar8 = lVar10 * -2;
      lVar5 = lVar3 * -2;
      lVar11 = lVar7 * -2;
      lVar12 = lVar2 * -2;
      uVar9 = 0;
      auVar70._8_2_ = 8;
      auVar70._0_8_ = 0x8000800080008;
      auVar70._10_2_ = 8;
      auVar70._12_2_ = 8;
      auVar70._14_2_ = 8;
      auVar70._16_2_ = 8;
      auVar70._18_2_ = 8;
      auVar70._20_2_ = 8;
      auVar70._22_2_ = 8;
      auVar70._24_2_ = 8;
      auVar70._26_2_ = 8;
      auVar70._28_2_ = 8;
      auVar70._30_2_ = 8;
      do {
        auVar18._8_8_ = 0;
        auVar18._0_8_ = *(ulong *)in;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = *(ulong *)((long)in + 0x120);
        auVar18 = vpunpcklqdq_avx(auVar21,auVar18);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = *(ulong *)((long)in + 0x240);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = *(ulong *)((long)in + 0x360);
        auVar21 = vpunpcklqdq_avx(auVar26,auVar13);
        auVar20._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar21;
        auVar20._16_16_ = ZEXT116(1) * auVar18;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = *(ulong *)((long)in + lVar2 * 2);
        auVar27._8_8_ = 0;
        auVar27._0_8_ = *(ulong *)((long)in + lVar2 * 2 + 0x120);
        auVar18 = vpunpcklqdq_avx(auVar27,auVar22);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = *(ulong *)((long)in + lVar2 * 2 + 0x240);
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)((long)in + lVar2 * 2 + 0x360);
        auVar21 = vpunpcklqdq_avx(auVar36,auVar28);
        auVar71._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar21;
        auVar71._16_16_ = ZEXT116(1) * auVar18;
        auVar25 = vpsubw_avx2(auVar71,auVar20);
        auVar73 = vpsraw_avx2(auVar25,0xf);
        auVar25 = vpabsw_avx2(auVar25);
        auVar71 = vpsrlw_avx2(auVar25,ZEXT416(uVar4));
        auVar71 = vpsubusw_avx2(auVar24,auVar71);
        auVar25 = vpminsw_avx2(auVar71,auVar25);
        auVar71 = vpaddw_avx2(auVar25,auVar73);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)((long)in + lVar12);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)((long)in + lVar12 + 0x120);
        auVar18 = vpunpcklqdq_avx(auVar37,auVar29);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)((long)in + lVar12 + 0x240);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = *(ulong *)((long)in + lVar12 + 0x360);
        auVar21 = vpunpcklqdq_avx(auVar51,auVar38);
        auVar62._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar21;
        auVar62._16_16_ = ZEXT116(1) * auVar18;
        auVar25 = vpsubw_avx2(auVar62,auVar20);
        auVar48 = vpsraw_avx2(auVar25,0xf);
        auVar25 = vpabsw_avx2(auVar25);
        auVar62 = vpsrlw_avx2(auVar25,ZEXT416(uVar4));
        auVar62 = vpsubusw_avx2(auVar24,auVar62);
        auVar25 = vpminsw_avx2(auVar62,auVar25);
        auVar25 = vpaddw_avx2(auVar48,auVar25);
        auVar71 = vpaddw_avx2(auVar48 ^ auVar25,auVar71 ^ auVar73);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)((long)in + lVar7 * 2);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)((long)in + lVar7 * 2 + 0x120);
        auVar18 = vpunpcklqdq_avx(auVar39,auVar30);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)((long)in + lVar7 * 2 + 0x240);
        auVar52._8_8_ = 0;
        auVar52._0_8_ = *(ulong *)((long)in + lVar7 * 2 + 0x360);
        auVar21 = vpunpcklqdq_avx(auVar52,auVar40);
        auVar73._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar21;
        auVar73._16_16_ = ZEXT116(1) * auVar18;
        auVar73 = vpsubw_avx2(auVar73,auVar20);
        auVar25 = vpabsw_avx2(auVar73);
        auVar13 = ZEXT416(uVar4);
        auVar62 = vpsrlw_avx2(auVar25,auVar13);
        auVar35 = vpsraw_avx2(auVar73,0xf);
        auVar62 = vpsubusw_avx2(auVar24,auVar62);
        auVar25 = vpminsw_avx2(auVar25,auVar62);
        auVar62 = vpaddw_avx2(auVar25,auVar35);
        auVar41._8_8_ = 0;
        auVar41._0_8_ = *(ulong *)((long)in + lVar11);
        auVar53._8_8_ = 0;
        auVar53._0_8_ = *(ulong *)((long)in + lVar11 + 0x120);
        auVar18 = vpunpcklqdq_avx(auVar53,auVar41);
        auVar54._8_8_ = 0;
        auVar54._0_8_ = *(ulong *)((long)in + lVar11 + 0x240);
        auVar65._8_8_ = 0;
        auVar65._0_8_ = *(ulong *)((long)in + lVar11 + 0x360);
        auVar21 = vpunpcklqdq_avx(auVar65,auVar54);
        auVar50._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar21;
        auVar50._16_16_ = ZEXT116(1) * auVar18;
        auVar48 = vpsubw_avx2(auVar50,auVar20);
        auVar25 = vpabsw_avx2(auVar48);
        auVar73 = vpsrlw_avx2(auVar25,auVar13);
        auVar48 = vpsraw_avx2(auVar48,0xf);
        auVar73 = vpsubusw_avx2(auVar24,auVar73);
        auVar25 = vpminsw_avx2(auVar25,auVar73);
        auVar25 = vpaddw_avx2(auVar25,auVar48);
        auVar25 = vpaddw_avx2(auVar25 ^ auVar48,auVar62 ^ auVar35);
        auVar25 = vpaddw_avx2(auVar71,auVar25);
        auVar73 = vpmullw_avx2(auVar25,auVar34);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *(ulong *)((long)in + lVar3 * 2);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = *(ulong *)((long)in + lVar3 * 2 + 0x120);
        auVar18 = vpunpcklqdq_avx(auVar42,auVar31);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)((long)in + lVar3 * 2 + 0x240);
        auVar55._8_8_ = 0;
        auVar55._0_8_ = *(ulong *)((long)in + lVar3 * 2 + 0x360);
        auVar21 = vpunpcklqdq_avx(auVar55,auVar43);
        auVar48._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar21;
        auVar48._16_16_ = ZEXT116(1) * auVar18;
        auVar25 = vpsubw_avx2(auVar48,auVar20);
        auVar48 = vpsraw_avx2(auVar25,0xf);
        auVar25 = vpabsw_avx2(auVar25);
        auVar71 = vpsrlw_avx2(auVar25,auVar13);
        auVar71 = vpsubusw_avx2(auVar24,auVar71);
        auVar25 = vpminsw_avx2(auVar71,auVar25);
        auVar71 = vpaddw_avx2(auVar48,auVar25);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)((long)in + lVar5);
        auVar56._8_8_ = 0;
        auVar56._0_8_ = *(ulong *)((long)in + lVar5 + 0x120);
        auVar18 = vpunpcklqdq_avx(auVar56,auVar44);
        auVar57._8_8_ = 0;
        auVar57._0_8_ = *(ulong *)((long)in + lVar5 + 0x240);
        auVar66._8_8_ = 0;
        auVar66._0_8_ = *(ulong *)((long)in + lVar5 + 0x360);
        auVar21 = vpunpcklqdq_avx(auVar66,auVar57);
        auVar35._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar21;
        auVar35._16_16_ = ZEXT116(1) * auVar18;
        auVar25 = vpsubw_avx2(auVar35,auVar20);
        auVar35 = vpsraw_avx2(auVar25,0xf);
        auVar25 = vpabsw_avx2(auVar25);
        auVar62 = vpsrlw_avx2(auVar25,auVar13);
        auVar62 = vpsubusw_avx2(auVar24,auVar62);
        auVar25 = vpminsw_avx2(auVar25,auVar62);
        auVar25 = vpaddw_avx2(auVar25,auVar35);
        auVar71 = vpaddw_avx2(auVar25 ^ auVar35,auVar48 ^ auVar71);
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)((long)in + lVar10 * 2);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = *(ulong *)((long)in + lVar10 * 2 + 0x120);
        auVar18 = vpunpcklqdq_avx(auVar58,auVar45);
        auVar59._8_8_ = 0;
        auVar59._0_8_ = *(ulong *)((long)in + lVar10 * 2 + 0x240);
        auVar67._8_8_ = 0;
        auVar67._0_8_ = *(ulong *)((long)in + lVar10 * 2 + 0x360);
        auVar21 = vpunpcklqdq_avx(auVar67,auVar59);
        auVar49._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar21;
        auVar49._16_16_ = ZEXT116(1) * auVar18;
        auVar48 = vpsubw_avx2(auVar49,auVar20);
        auVar25 = vpabsw_avx2(auVar48);
        auVar62 = vpsrlw_avx2(auVar25,ZEXT416(uVar4));
        auVar50 = vpsraw_avx2(auVar48,0xf);
        auVar62 = vpsubusw_avx2(auVar24,auVar62);
        auVar25 = vpminsw_avx2(auVar25,auVar62);
        auVar62 = vpaddw_avx2(auVar25,auVar50);
        auVar60._8_8_ = 0;
        auVar60._0_8_ = *(ulong *)((long)in + lVar8);
        auVar68._8_8_ = 0;
        auVar68._0_8_ = *(ulong *)((long)in + lVar8 + 0x120);
        auVar18 = vpunpcklqdq_avx(auVar68,auVar60);
        auVar69._8_8_ = 0;
        auVar69._0_8_ = *(ulong *)((long)in + lVar8 + 0x240);
        auVar74._8_8_ = 0;
        auVar74._0_8_ = *(ulong *)((long)in + lVar8 + 0x360);
        auVar21 = vpunpcklqdq_avx(auVar74,auVar69);
        auVar64._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar21;
        auVar64._16_16_ = ZEXT116(1) * auVar18;
        auVar35 = vpsubw_avx2(auVar64,auVar20);
        auVar25 = vpabsw_avx2(auVar35);
        auVar48 = vpsrlw_avx2(auVar25,ZEXT416(uVar4));
        auVar35 = vpsraw_avx2(auVar35,0xf);
        auVar48 = vpsubusw_avx2(auVar24,auVar48);
        auVar25 = vpminsw_avx2(auVar25,auVar48);
        auVar25 = vpaddw_avx2(auVar25,auVar35);
        auVar25 = vpaddw_avx2(auVar62 ^ auVar50,auVar25 ^ auVar35);
        auVar25 = vpaddw_avx2(auVar25,auVar71);
        auVar25 = vpmullw_avx2(auVar25,auVar15);
        auVar25 = vpaddw_avx2(auVar25,auVar73);
        auVar71 = vpsraw_avx2(auVar25,0xf);
        auVar25 = vpaddw_avx2(auVar25,auVar70);
        auVar25 = vpaddw_avx2(auVar25,auVar71);
        auVar25 = vpsraw_avx2(auVar25,4);
        auVar25 = vpaddw_avx2(auVar25,auVar20);
        auVar25 = vpackuswb_avx2(auVar25,auVar24);
        *(int *)dest = auVar25._20_4_;
        *(int *)((long)dest + lVar6) = auVar25._16_4_;
        *(int *)((long)dest + lVar6 * 2) = auVar25._4_4_;
        *(int *)((long)dest + lVar6 * 3) = auVar25._0_4_;
        uVar9 = uVar9 + 4;
        in = (uint16_t *)((long)in + 0x480);
        dest = (void *)((long)dest + lVar6 * 4);
      } while (uVar9 < (uint)block_height);
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_8_2)(void *dest, int dstride, const uint16_t *in,
                                int pri_strength, int sec_strength, int dir,
                                int pri_damping, int sec_damping,
                                int coeff_shift, int block_width,
                                int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/0,
                     /*enable_secondary=*/1);
  } else {
    filter_block_4x4(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/0,
                     /*enable_secondary=*/1);
  }
}